

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,btVector3 *svertices,uint stride,uint *vcount,
          btVector3 *vertices,btScalar normalepsilon,btVector3 *scale)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar *pbVar3;
  btVector3 *pbVar4;
  uint in_ECX;
  btVector3 *in_RDX;
  uint in_ESI;
  uint *in_R8;
  long in_R9;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  btVector3 *in_stack_00000008;
  btScalar z2_1;
  btScalar z1_1;
  btScalar y2_1;
  btScalar y1_1;
  btScalar x2_1;
  btScalar x1_1;
  btScalar len_1;
  btScalar cz;
  btScalar cy;
  btScalar cx;
  btScalar dz_2;
  btScalar dy_2;
  btScalar dx_2;
  int j_2;
  btVector3 *p_2;
  uint i_2;
  btScalar bmax_1 [3];
  btScalar bmin_1 [3];
  btVector3 *dest;
  btScalar dist2;
  btScalar dist1;
  btScalar dz_1;
  btScalar dy_1;
  btScalar dx_1;
  btScalar z;
  btScalar y;
  btScalar x;
  btVector3 *v;
  uint j_1;
  btScalar pz;
  btScalar py;
  btScalar px;
  btVector3 *p_1;
  uint i_1;
  btScalar z2;
  btScalar z1;
  btScalar y2;
  btScalar y1;
  btScalar x2;
  btScalar x1;
  btScalar len;
  btVector3 center;
  btScalar dz;
  btScalar dy;
  btScalar dx;
  int j;
  btScalar *p;
  uint i;
  char *vtx;
  btScalar bmax [3];
  btScalar bmin [3];
  btScalar recip [3];
  btScalar in_stack_fffffffffffffe48;
  btScalar in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe50;
  btScalar in_stack_fffffffffffffe54;
  btScalar in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  btScalar in_stack_fffffffffffffe60;
  btScalar in_stack_fffffffffffffe64;
  int local_134;
  uint local_128;
  float local_124 [6];
  uint local_10c;
  btVector3 *local_108;
  btScalar local_100;
  btScalar local_fc;
  btScalar local_f8;
  float local_f4;
  btScalar local_f0;
  btScalar local_ec;
  btScalar local_e8;
  btScalar local_e4;
  btVector3 *local_e0;
  uint local_d8;
  float local_d4;
  btScalar local_d0;
  btScalar local_cc;
  btVector3 *local_c8;
  uint local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  btVector3 local_a0;
  float local_90;
  float local_8c;
  float local_88;
  int local_84;
  btVector3 *local_80;
  uint local_74;
  btVector3 *local_70;
  float local_64 [7];
  float local_48;
  float local_44;
  undefined4 local_40;
  float local_3c;
  long local_38;
  uint *local_30;
  uint local_24;
  btVector3 *local_20;
  uint local_14;
  bool local_1;
  
  if (in_ESI == 0) {
    local_1 = false;
  }
  else {
    local_40 = 0;
    local_3c = in_XMM0_Da;
    local_38 = in_R9;
    local_30 = in_R8;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    btAlignedObjectArray<int>::resize
              ((btAlignedObjectArray<int> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (int)in_stack_fffffffffffffe5c,
               (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    *local_30 = 0;
    memset(local_64 + 6,0,0xc);
    pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
    if (pbVar3 != (btScalar *)0x0) {
      pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
      *pbVar3 = 1.0;
      pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
      pbVar3[1] = 1.0;
      pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
      pbVar3[2] = 1.0;
    }
    local_64[3] = 3.4028235e+38;
    local_64[4] = 3.4028235e+38;
    local_64[5] = 3.4028235e+38;
    local_64[0] = -3.4028235e+38;
    local_64[1] = -3.4028235e+38;
    local_64[2] = -3.4028235e+38;
    local_70 = local_20;
    for (local_74 = 0; pbVar4 = local_70, local_74 < local_14; local_74 = local_74 + 1) {
      local_80 = local_70;
      local_70 = (btVector3 *)((long)local_70->m_floats + (ulong)local_24);
      for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
        if (pbVar4->m_floats[local_84] < local_64[(long)local_84 + 3]) {
          local_64[(long)local_84 + 3] = pbVar4->m_floats[local_84];
        }
        if (local_64[local_84] <= pbVar4->m_floats[local_84] &&
            pbVar4->m_floats[local_84] != local_64[local_84]) {
          local_64[local_84] = pbVar4->m_floats[local_84];
        }
      }
    }
    local_88 = local_64[0] - local_64[3];
    local_8c = local_64[1] - local_64[4];
    local_90 = local_64[2] - local_64[5];
    btVector3::btVector3(&local_a0);
    fVar5 = local_88 * 0.5 + local_64[3];
    pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
    *pbVar3 = fVar5;
    fVar5 = local_8c * 0.5 + local_64[4];
    pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
    pbVar3[1] = fVar5;
    fVar5 = local_90 * 0.5 + local_64[5];
    pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
    pbVar3[2] = fVar5;
    if ((((local_88 < 1e-06) || (local_8c < 1e-06)) || (local_90 < 1e-06)) || (local_14 < 3)) {
      local_a4 = 3.4028235e+38;
      if ((1e-06 < local_88) && (local_88 < 3.4028235e+38)) {
        local_a4 = local_88;
      }
      if ((1e-06 < local_8c) && (local_8c < local_a4)) {
        local_a4 = local_8c;
      }
      if ((1e-06 < local_90) && (local_90 < local_a4)) {
        local_a4 = local_90;
      }
      if ((local_a4 != 3.4028235e+38) || (NAN(local_a4))) {
        if (local_88 < 1e-06) {
          local_88 = local_a4 * 0.05;
        }
        if (local_8c < 1e-06) {
          local_8c = local_a4 * 0.05;
        }
        if (local_90 < 1e-06) {
          local_90 = local_a4 * 0.05;
        }
      }
      else {
        local_90 = 0.01;
        local_8c = 0.01;
        local_88 = 0.01;
      }
      pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
      local_a8 = *pbVar3 - local_88;
      pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
      local_ac = *pbVar3 + local_88;
      pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
      local_b0 = pbVar3[1] - local_8c;
      pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
      local_b4 = pbVar3[1] + local_8c;
      pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
      local_b8 = pbVar3[2] - local_90;
      pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
      local_bc = pbVar3[2] + local_90;
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      local_1 = true;
    }
    else {
      pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
      fVar5 = local_88;
      if (pbVar3 != (btScalar *)0x0) {
        pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
        fVar6 = local_8c;
        *pbVar3 = fVar5;
        pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
        fVar5 = local_90;
        pbVar3[1] = fVar6;
        pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
        pbVar3[2] = fVar5;
        fVar6 = 1.0 / local_88;
        local_48 = 1.0 / local_8c;
        local_44 = 1.0 / local_90;
        local_64[6] = fVar6;
        pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
        fVar5 = local_48;
        *pbVar3 = fVar6 * *pbVar3;
        pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
        fVar6 = local_44;
        pbVar3[1] = fVar5 * pbVar3[1];
        pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
        pbVar3[2] = fVar6 * pbVar3[2];
      }
      local_70 = local_20;
      for (local_c0 = 0; pbVar4 = local_70, local_c0 < local_14; local_c0 = local_c0 + 1) {
        local_c8 = local_70;
        local_70 = (btVector3 *)((long)local_70->m_floats + (ulong)local_24);
        pbVar3 = btVector3::getX(pbVar4);
        local_cc = *pbVar3;
        pbVar3 = btVector3::getY(local_c8);
        local_d0 = *pbVar3;
        pbVar3 = btVector3::getZ(local_c8);
        local_d4 = *pbVar3;
        pbVar3 = btVector3::operator_cast_to_float_(in_stack_00000008);
        if (pbVar3 != (btScalar *)0x0) {
          local_cc = local_cc * local_64[6];
          local_d0 = local_d0 * local_48;
          local_d4 = local_d4 * local_44;
        }
        for (local_d8 = 0; local_d8 < *local_30; local_d8 = local_d8 + 1) {
          local_e0 = (btVector3 *)(local_38 + (ulong)local_d8 * 0x10);
          pbVar3 = btVector3::operator_cast_to_float_(local_e0);
          local_e4 = *pbVar3;
          pbVar3 = btVector3::operator_cast_to_float_(local_e0);
          local_e8 = pbVar3[1];
          pbVar3 = btVector3::operator_cast_to_float_(local_e0);
          local_ec = pbVar3[2];
          local_f0 = btFabs(local_e4 - local_cc);
          local_f4 = btFabs(local_e8 - local_d0);
          local_f8 = btFabs(local_ec - local_d4);
          if (((local_f0 < local_3c) && (local_f4 < local_3c)) && (local_f8 < local_3c)) {
            in_stack_fffffffffffffe54 = local_cc;
            in_stack_fffffffffffffe58 = local_d0;
            in_stack_fffffffffffffe5c = local_d4;
            pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
            local_fc = GetDist(in_stack_fffffffffffffe54,in_stack_fffffffffffffe58,
                               in_stack_fffffffffffffe5c,pbVar3);
            pbVar3 = btVector3::operator_cast_to_float_(local_e0);
            in_stack_fffffffffffffe60 = *pbVar3;
            pbVar3 = btVector3::operator_cast_to_float_(local_e0);
            in_stack_fffffffffffffe64 = pbVar3[1];
            pbVar3 = btVector3::operator_cast_to_float_(local_e0);
            bVar1 = pbVar3[2];
            pbVar3 = btVector3::operator_cast_to_float_(&local_a0);
            local_100 = GetDist(in_stack_fffffffffffffe60,in_stack_fffffffffffffe64,bVar1,pbVar3);
            if (local_100 < local_fc) {
              in_stack_fffffffffffffe48 = local_cc;
              pbVar3 = btVector3::operator_cast_to_float_(local_e0);
              *pbVar3 = in_stack_fffffffffffffe48;
              in_stack_fffffffffffffe4c = local_d0;
              pbVar3 = btVector3::operator_cast_to_float_(local_e0);
              pbVar3[1] = in_stack_fffffffffffffe4c;
              in_stack_fffffffffffffe50 = local_d4;
              pbVar3 = btVector3::operator_cast_to_float_(local_e0);
              pbVar3[2] = in_stack_fffffffffffffe50;
            }
            break;
          }
        }
        bVar1 = local_cc;
        if (local_d8 == *local_30) {
          local_108 = (btVector3 *)(local_38 + (ulong)*local_30 * 0x10);
          pbVar3 = btVector3::operator_cast_to_float_(local_108);
          bVar2 = local_d0;
          *pbVar3 = bVar1;
          pbVar3 = btVector3::operator_cast_to_float_(local_108);
          fVar5 = local_d4;
          pbVar3[1] = bVar2;
          pbVar3 = btVector3::operator_cast_to_float_(local_108);
          pbVar3[2] = fVar5;
          *local_30 = *local_30 + 1;
        }
        local_10c = local_d8;
        btAlignedObjectArray<int>::push_back
                  ((btAlignedObjectArray<int> *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
      local_124[3] = 3.4028235e+38;
      local_124[4] = 3.4028235e+38;
      local_124[5] = 3.4028235e+38;
      local_124[0] = -3.4028235e+38;
      local_124[1] = -3.4028235e+38;
      local_124[2] = -3.4028235e+38;
      for (local_128 = 0; local_128 < *local_30; local_128 = local_128 + 1) {
        pbVar4 = (btVector3 *)(local_38 + (ulong)local_128 * 0x10);
        for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
          pbVar3 = btVector3::operator_cast_to_float_(pbVar4);
          if (pbVar3[local_134] < local_124[(long)local_134 + 3]) {
            pbVar3 = btVector3::operator_cast_to_float_(pbVar4);
            local_124[(long)local_134 + 3] = pbVar3[local_134];
          }
          pbVar3 = btVector3::operator_cast_to_float_(pbVar4);
          if (local_124[local_134] <= pbVar3[local_134] && pbVar3[local_134] != local_124[local_134]
             ) {
            pbVar3 = btVector3::operator_cast_to_float_(pbVar4);
            local_124[local_134] = pbVar3[local_134];
          }
        }
      }
      if (((local_124[0] - local_124[3] < 1e-06) || (local_124[1] - local_124[4] < 1e-06)) ||
         ((local_124[2] - local_124[5] < 1e-06 || (*local_30 < 3)))) {
        *local_30 = 0;
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        addPoint((uint *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        local_1 = true;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
				   const btVector3 *svertices,
				   unsigned int stride,
				   unsigned int &vcount,       // output number of vertices
				   btVector3 *vertices,                 // location to store the results.
				   btScalar  normalepsilon,
				   btVector3& scale)
{
	if ( svcount == 0 ) return false;

	m_vertexIndexMapping.resize(0);


#define EPSILON btScalar(0.000001) /* close enough to consider two btScalaring point numbers to be 'the same'. */

	vcount = 0;

	btScalar recip[3]={0.f,0.f,0.f};

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

//	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const btScalar *p = (const btScalar *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	btScalar dx = bmax[0] - bmin[0];
	btScalar dy = bmax[1] - bmin[1];
	btScalar dz = bmax[2] - bmin[2];

	btVector3 center;

	center[0] = dx*btScalar(0.5) + bmin[0];
	center[1] = dy*btScalar(0.5) + bmin[1];
	center[2] = dz*btScalar(0.5) + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		btScalar len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = btScalar(0.01); // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * btScalar(0.05);
			if ( dz < EPSILON ) dz = len * btScalar(0.05);
		}

		btScalar x1 = center[0] - dx;
		btScalar x2 = center[0] + dx;

		btScalar y1 = center[1] - dy;
		btScalar y2 = center[1] + dy;

		btScalar z1 = center[2] - dz;
		btScalar z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{
		const btVector3 *p = (const btVector3 *)vtx;
		vtx+=stride;

		btScalar px = p->getX();
		btScalar py = p->getY();
		btScalar pz = p->getZ();

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

//		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				/// XXX might be broken
				btVector3& v = vertices[j];

				btScalar x = v[0];
				btScalar y = v[1];
				btScalar z = v[2];

				btScalar dx = btFabs(x - px );
				btScalar dy = btFabs(y - py );
				btScalar dz = btFabs(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					btScalar dist1 = GetDist(px,py,pz,center);
					btScalar dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
						
					}

					break;
				}
			}

			if ( j == vcount )
			{
				btVector3& dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
//	if ( 1 )
	{
		btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const btVector3& p = vertices[i];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		btScalar dx = bmax[0] - bmin[0];
		btScalar dy = bmax[1] - bmin[1];
		btScalar dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			btScalar cx = dx*btScalar(0.5) + bmin[0];
			btScalar cy = dy*btScalar(0.5) + bmin[1];
			btScalar cz = dz*btScalar(0.5) + bmin[2];

			btScalar len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = btScalar(0.01); // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * btScalar(0.05);
				if ( dz < EPSILON ) dz = len * btScalar(0.05);
			}

			btScalar x1 = cx - dx;
			btScalar x2 = cx + dx;

			btScalar y1 = cy - dy;
			btScalar y2 = cy + dy;

			btScalar z1 = cz - dz;
			btScalar z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}